

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O1

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  long lVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  uint64_t uVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  secp256k1_gej *r_00;
  ulong *puVar121;
  ulong uVar122;
  int in_ECX;
  uint uVar123;
  long lVar124;
  ulong uVar125;
  ulong uVar126;
  uint uVar127;
  long lVar128;
  int iVar129;
  secp256k1_gej *r_01;
  ulong *puVar130;
  ulong uVar131;
  ulong *puVar132;
  secp256k1_gej *in_R8;
  ulong uVar133;
  ulong uVar134;
  bool bVar135;
  byte bVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  uint64_t uVar163;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  uint64_t uVar173;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  ulong uVar186;
  undefined4 uVar192;
  ulong uVar193;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined4 uVar199;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  uint64_t tmp3_1;
  secp256k1_fe Z;
  secp256k1_scalar q_lam;
  secp256k1_scalar q_1;
  secp256k1_ge pre_a [8];
  secp256k1_ge pre_a_lam [8];
  int wnaf_1 [33];
  int wnaf_lam [33];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  ulong local_818;
  uint64_t uStack_810;
  uint64_t uStack_808;
  uint64_t uStack_800;
  uint64_t uStack_7f8;
  ulong local_7f0;
  int local_7e8;
  uint local_7e0;
  uint local_7dc;
  secp256k1_gej *local_7d8;
  uint64_t *local_7d0;
  secp256k1_fe *local_7c8;
  secp256k1_fe *local_7c0;
  undefined1 local_7b8 [32];
  ulong local_798;
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  ulong local_770;
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  ulong local_748;
  uint local_740;
  secp256k1_fe local_730;
  secp256k1_scalar local_708;
  secp256k1_scalar local_6e8;
  secp256k1_ge local_6c8;
  undefined1 auStack_670 [16];
  undefined1 auStack_660 [16];
  ulong auStack_650 [2];
  undefined1 auStack_640 [16];
  undefined1 auStack_630 [552];
  secp256k1_ge local_408;
  undefined1 auStack_3b0 [16];
  undefined1 auStack_3a0 [16];
  ulong auStack_390 [2];
  undefined1 auStack_380 [16];
  undefined1 auStack_370 [552];
  uint local_148 [32];
  uint local_c8;
  uint local_b8 [32];
  uint local_38;
  
  bVar136 = 0;
  if (a->infinity == 0) {
    secp256k1_scalar_split_lambda(&local_6e8,&local_708,scalar);
    local_7e0 = secp256k1_wnaf_const((int *)local_148,&local_6e8,4,in_ECX);
    local_7dc = secp256k1_wnaf_const((int *)local_b8,&local_708,4,in_ECX);
    r->infinity = a->infinity;
    (r->x).n[4] = (a->x).n[4];
    uVar163 = (a->x).n[0];
    uVar173 = (a->x).n[1];
    uVar116 = (a->x).n[3];
    (r->x).n[2] = (a->x).n[2];
    (r->x).n[3] = uVar116;
    (r->x).n[0] = uVar163;
    (r->x).n[1] = uVar173;
    local_7c8 = &r->y;
    uVar163 = (a->y).n[1];
    uVar173 = (a->y).n[2];
    uVar116 = (a->y).n[3];
    (r->y).n[0] = (a->y).n[0];
    (r->y).n[1] = uVar163;
    (r->y).n[2] = uVar173;
    (r->y).n[3] = uVar116;
    (r->y).n[4] = (a->y).n[4];
    local_7c0 = &r->z;
    (r->z).n[0] = 1;
    local_7d0 = (r->z).n + 1;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    local_7d8 = r;
    secp256k1_ecmult_odd_multiples_table((int)&local_6c8,&local_408,&local_730,&r->x,in_R8);
    secp256k1_ge_table_set_globalz(8,&local_6c8,&local_408.x);
    lVar128 = 0x28;
    do {
      secp256k1_fe_impl_normalize_weak((secp256k1_fe *)((long)local_6c8.x.n + lVar128));
      r_01 = local_7d8;
      lVar128 = lVar128 + 0x58;
    } while (lVar128 != 0x2e8);
    lVar128 = 0;
    do {
      puVar121 = (ulong *)((long)local_408.x.n + lVar128);
      puVar130 = (ulong *)((long)local_6c8.x.n + lVar128);
      puVar132 = puVar121;
      for (lVar124 = 0xb; lVar124 != 0; lVar124 = lVar124 + -1) {
        *puVar132 = *puVar130;
        puVar130 = puVar130 + (ulong)bVar136 * -2 + 1;
        puVar132 = puVar132 + (ulong)bVar136 * -2 + 1;
      }
      uVar126 = *puVar121;
      uVar134 = *(ulong *)((long)local_408.x.n + lVar128 + 8);
      uVar186 = *(ulong *)((long)local_408.x.n + lVar128 + 0x10);
      uVar193 = *(ulong *)((long)local_408.x.n + lVar128 + 0x18);
      uVar1 = *(ulong *)((long)local_408.x.n + lVar128 + 0x20);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar193;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar186;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar134;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar126;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar1;
      uVar122 = SUB168(ZEXT816(0x7ae96a2b657c) * auVar41,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar122 & 0xfffffffffffff;
      auVar2 = ZEXT816(0x7512f58995c13) * auVar38 + ZEXT816(0x96c28719501ee) * auVar37 +
               ZEXT816(0xc3434e99cf049) * auVar39 + ZEXT816(0x7106e64479ea) * auVar40 +
               auVar2 * ZEXT816(0x1000003d10);
      uVar125 = auVar2._0_8_;
      uVar131 = uVar125 & 0xfffffffffffff;
      local_7b8._4_4_ = (undefined4)(uVar131 >> 0x20);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar125 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar1;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar193;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar186;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar134;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar126;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar122 >> 0x34 | SUB168(ZEXT816(0x7ae96a2b657c) * auVar41,8) << 0xc;
      auVar2 = ZEXT816(0x96c28719501ee) * auVar42 + auVar101 + ZEXT816(0x7512f58995c13) * auVar43 +
               ZEXT816(0xc3434e99cf049) * auVar44 + ZEXT816(0x7106e64479ea) * auVar45 +
               ZEXT816(0x7ae96a2b657c) * auVar46 + auVar3 * ZEXT816(0x1000003d10);
      uVar122 = auVar2._0_8_;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar122 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar126;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar1;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar193;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar186;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar134;
      auVar2 = ZEXT816(0x7512f58995c13) * auVar48 + auVar102 + ZEXT816(0xc3434e99cf049) * auVar49 +
               ZEXT816(0x7106e64479ea) * auVar50 + ZEXT816(0x7ae96a2b657c) * auVar51;
      uVar125 = auVar2._0_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar125 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = (uVar125 & 0xfffffffffffff) << 4 | (uVar122 & 0xfffffffffffff) >> 0x30;
      uVar125 = auVar158._0_8_;
      auVar158 = ZEXT816(0x96c28719501ee) * auVar47 + ZEXT816(0x1000003d1) * auVar52;
      *puVar121 = uVar125 & 0xfffffffffffff;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar125 >> 0x34 | auVar158._8_8_ << 0xc;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar134;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar126;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar1;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar193;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar186;
      auVar3 = ZEXT816(0xc3434e99cf049) * auVar55 + auVar104 + ZEXT816(0x7106e64479ea) * auVar56 +
               ZEXT816(0x7ae96a2b657c) * auVar57;
      uVar125 = auVar3._0_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar125 & 0xfffffffffffff;
      auVar2 = ZEXT816(0x96c28719501ee) * auVar53 + auVar103 + ZEXT816(0x7512f58995c13) * auVar54 +
               auVar4 * ZEXT816(0x1000003d10);
      uVar133 = auVar2._0_8_;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uVar125 >> 0x34 | auVar3._8_8_ << 0xc;
      *(ulong *)((long)local_408.x.n + lVar128 + 8) = uVar133 & 0xfffffffffffff;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar133 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar186;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar134;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar126;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar1;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar193;
      auVar3 = ZEXT816(0x7106e64479ea) * auVar61 + auVar106 + ZEXT816(0x7ae96a2b657c) * auVar62;
      uVar126 = auVar3._0_8_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar126 & 0xfffffffffffff;
      auVar2 = ZEXT816(0x96c28719501ee) * auVar58 + auVar105 + ZEXT816(0x7512f58995c13) * auVar59 +
               ZEXT816(0xc3434e99cf049) * auVar60 + auVar5 * ZEXT816(0x1000003d10);
      uVar134 = auVar2._0_8_;
      *(ulong *)((long)local_408.x.n + lVar128 + 0x10) = uVar134 & 0xfffffffffffff;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = (uVar134 >> 0x34 | auVar2._8_8_ << 0xc) + uVar131;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar126 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar107 = auVar6 * ZEXT816(0x1000003d10) + auVar107;
      uVar126 = auVar107._0_8_;
      *(ulong *)((long)local_408.x.n + lVar128 + 0x18) = uVar126 & 0xfffffffffffff;
      *(ulong *)((long)local_408.x.n + lVar128 + 0x20) =
           (uVar126 >> 0x34 | auVar107._8_8_ << 0xc) + (uVar122 & 0xffffffffffff);
      lVar128 = lVar128 + 0x58;
    } while (lVar128 != 0x2c0);
    uVar127 = ((int)local_c8 >> 0x1f) + local_c8 ^ (int)local_c8 >> 0x1f;
    local_838._8_8_ = local_6c8.x.n[1];
    local_838._0_8_ = local_6c8.x.n[0];
    local_828._8_8_ = local_6c8.x.n[3];
    local_828._0_8_ = local_6c8.x.n[2];
    auVar158._8_8_ = local_6c8.y.n[2];
    auVar158._0_8_ = local_6c8.y.n[1];
    auVar137._8_8_ = local_6c8.y.n[4];
    auVar137._0_8_ = local_6c8.y.n[3];
    lVar128 = 0;
    auVar150._8_4_ = 0xffffffff;
    auVar150._0_8_ = 0xffffffffffffffff;
    auVar150._12_4_ = 0xffffffff;
    uVar163 = local_6c8.x.n[4];
    uVar173 = local_6c8.y.n[0];
    do {
      bVar135 = (ulong)(uint)((int)uVar127 >> 1) * 0x58 + -0x58 == lVar128;
      uVar193 = (ulong)bVar135;
      uVar186 = (ulong)bVar135;
      uVar126 = -uVar186;
      uVar134 = -uVar193;
      uVar186 = uVar186 - 1;
      uVar193 = uVar193 + auVar150._8_8_;
      uVar192 = (undefined4)(uVar186 >> 0x20);
      auVar187._8_4_ = (undefined4)uVar193;
      auVar187._12_4_ = (undefined4)(uVar193 >> 0x20);
      auVar89._8_4_ = (int)uVar186;
      auVar89._0_8_ = uVar186;
      auVar89._12_4_ = uVar192;
      uVar199 = (undefined4)(uVar126 >> 0x20);
      auVar97._8_4_ = (int)uVar126;
      auVar97._0_8_ = uVar126;
      auVar97._12_4_ = uVar199;
      local_838 = *(undefined1 (*) [16])(auStack_670 + lVar128) & auVar97 | local_838 & auVar89;
      auVar90._8_4_ = (int)uVar186;
      auVar90._0_8_ = uVar186;
      auVar90._12_4_ = uVar192;
      auVar98._8_4_ = (int)uVar126;
      auVar98._0_8_ = uVar126;
      auVar98._12_4_ = uVar199;
      local_828 = *(undefined1 (*) [16])(auStack_660 + lVar128) & auVar98 | local_828 & auVar90;
      uVar163 = *(ulong *)((long)auStack_650 + lVar128) & uVar126 | uVar163 & uVar186;
      uVar173 = *(ulong *)((long)auStack_650 + lVar128 + 8) & uVar134 | uVar173 & uVar193;
      auVar187._0_8_ = uVar193;
      auVar194._8_4_ = (int)uVar134;
      auVar194._0_8_ = uVar134;
      auVar194._12_4_ = (int)(uVar134 >> 0x20);
      auVar158 = *(undefined1 (*) [16])(auStack_640 + lVar128) & auVar194 | auVar158 & auVar187;
      auVar137 = *(undefined1 (*) [16])(auStack_630 + lVar128) & auVar194 | auVar137 & auVar187;
      lVar128 = lVar128 + 0x58;
    } while (lVar128 != 0x268);
    uStack_808 = auVar158._0_8_;
    uStack_800 = auVar158._8_8_;
    uStack_7f8 = auVar137._0_8_;
    local_7f0 = auVar137._8_8_;
    lVar128 = 0;
    auVar117._8_8_ = uStack_808;
    auVar117._0_8_ = uVar173;
    auVar151._0_8_ = 0x3ffffbfffff0bc - uVar173;
    auVar151._8_8_ = 0x3ffffffffffffc - uStack_808;
    auVar118._8_8_ = uStack_7f8;
    auVar118._0_8_ = uStack_800;
    auVar164._0_8_ = 0x3ffffffffffffc - uStack_800;
    auVar164._8_8_ = 0x3ffffffffffffc - uStack_7f8;
    lVar124 = (long)(int)(uint)(local_c8 != uVar127);
    uVar126 = lVar124 - 1;
    uVar134 = -lVar124;
    auVar174._8_4_ = (int)uVar126;
    auVar174._0_8_ = uVar126;
    auVar174._12_4_ = (int)(uVar126 >> 0x20);
    auVar180._8_4_ = (int)uVar134;
    auVar180._0_8_ = uVar134;
    auVar180._12_4_ = (int)(uVar134 >> 0x20);
    auVar158 = auVar151 & auVar180 | auVar117 & auVar174;
    uStack_810 = auVar158._0_8_;
    uStack_808 = auVar158._8_8_;
    auVar158 = auVar164 & auVar180 | auVar174 & auVar118;
    uStack_800 = auVar158._0_8_;
    uStack_7f8 = auVar158._8_8_;
    local_7d8->infinity = 0;
    (local_7d8->x).n[4] = uVar163;
    (local_7d8->x).n[2] = local_828._0_8_;
    (local_7d8->x).n[3] = local_828._8_8_;
    (local_7d8->x).n[0] = local_838._0_8_;
    (local_7d8->x).n[1] = local_838._8_8_;
    local_7c8->n[2] = uStack_800;
    local_7c8->n[3] = uStack_7f8;
    local_7c8->n[4] = uVar134 & 0x3fffffffffffc - local_7f0 | uVar126 & local_7f0;
    local_7c8->n[0] = uStack_810;
    local_7c8->n[1] = uStack_808;
    (local_7d8->z).n[0] = 1;
    local_7d0[2] = 0;
    local_7d0[3] = 0;
    *local_7d0 = 0;
    local_7d0[1] = 0;
    uVar127 = ((int)local_38 >> 0x1f) + local_38 ^ (int)local_38 >> 0x1f;
    local_838._8_8_ = local_408.x.n[1];
    local_838._0_8_ = local_408.x.n[0];
    local_828._8_8_ = local_408.x.n[3];
    local_828._0_8_ = local_408.x.n[2];
    auVar159._8_8_ = local_408.y.n[0];
    auVar159._0_8_ = local_408.x.n[4];
    auVar152._8_8_ = local_408.y.n[2];
    auVar152._0_8_ = local_408.y.n[1];
    auVar138._8_8_ = local_408.y.n[4];
    auVar138._0_8_ = local_408.y.n[3];
    auVar165._8_4_ = 0xffffffff;
    auVar165._0_8_ = 0xffffffffffffffff;
    auVar165._12_4_ = 0xffffffff;
    do {
      bVar135 = (ulong)(uint)((int)uVar127 >> 1) * 0x58 + -0x58 == lVar128;
      uVar134 = (ulong)bVar135;
      uVar126 = (ulong)bVar135;
      lVar124 = -uVar126;
      lVar108 = -uVar134;
      auVar196._8_8_ = lVar108;
      auVar196._0_8_ = lVar124;
      auVar188._0_8_ = uVar126 - 1;
      auVar188._8_8_ = uVar134 + auVar165._8_8_;
      uVar192 = (undefined4)((ulong)auVar188._0_8_ >> 0x20);
      auVar189._8_4_ = (undefined4)auVar188._8_8_;
      auVar189._12_4_ = (undefined4)((ulong)auVar188._8_8_ >> 0x20);
      auVar91._8_4_ = (int)auVar188._0_8_;
      auVar91._0_8_ = auVar188._0_8_;
      auVar91._12_4_ = uVar192;
      uVar199 = (undefined4)((ulong)lVar124 >> 0x20);
      auVar99._8_4_ = (int)lVar124;
      auVar99._0_8_ = lVar124;
      auVar99._12_4_ = uVar199;
      local_838 = *(undefined1 (*) [16])(auStack_3b0 + lVar128) & auVar99 | local_838 & auVar91;
      auVar92._8_4_ = (int)auVar188._0_8_;
      auVar92._0_8_ = auVar188._0_8_;
      auVar92._12_4_ = uVar192;
      auVar100._8_4_ = (int)lVar124;
      auVar100._0_8_ = lVar124;
      auVar100._12_4_ = uVar199;
      local_828 = *(undefined1 (*) [16])(auStack_3a0 + lVar128) & auVar100 | local_828 & auVar92;
      auVar159 = *(undefined1 (*) [16])((long)auStack_390 + lVar128) & auVar196 |
                 auVar159 & auVar188;
      auVar189._0_8_ = auVar188._8_8_;
      auVar195._8_4_ = (int)lVar108;
      auVar195._0_8_ = lVar108;
      auVar195._12_4_ = (int)((ulong)lVar108 >> 0x20);
      auVar152 = *(undefined1 (*) [16])(auStack_380 + lVar128) & auVar195 | auVar152 & auVar189;
      auVar138 = *(undefined1 (*) [16])(auStack_370 + lVar128) & auVar195 | auVar138 & auVar189;
      lVar128 = lVar128 + 0x58;
    } while (lVar128 != 0x268);
    local_818 = auVar159._0_8_;
    local_7e8 = 0;
    local_7b8._0_4_ = ZEXT14(local_38 != uVar127);
    uVar126 = (long)(int)local_7b8._0_4_ - 1;
    uVar134 = -(long)(int)local_7b8._0_4_;
    auVar160._0_8_ = auVar159._8_8_;
    auVar160._8_4_ = auVar152._0_4_;
    auVar160._12_4_ = auVar152._4_4_;
    auVar166._0_8_ = 0x3ffffbfffff0bc - auVar160._0_8_;
    auVar166._8_8_ = 0x3ffffffffffffc - auVar160._8_8_;
    auVar175._8_4_ = (int)uVar126;
    auVar175._0_8_ = uVar126;
    auVar175._12_4_ = (int)(uVar126 >> 0x20);
    auVar181._8_4_ = (int)uVar134;
    auVar181._0_8_ = uVar134;
    auVar181._12_4_ = (int)(uVar134 >> 0x20);
    auVar158 = auVar166 & auVar181 | auVar160 & auVar175;
    uStack_810 = auVar158._0_8_;
    uStack_808 = auVar158._8_8_;
    auVar153._0_8_ = auVar152._8_8_;
    auVar153._8_4_ = auVar138._0_4_;
    auVar153._12_4_ = auVar138._4_4_;
    auVar139._0_8_ = 0x3ffffffffffffc - auVar153._0_8_;
    auVar139._8_8_ = 0x3ffffffffffffc - auVar153._8_8_;
    auVar158 = auVar139 & auVar181 | auVar153 & auVar175;
    uStack_800 = auVar158._0_8_;
    uStack_7f8 = auVar158._8_8_;
    local_7f0 = uVar134 & 0x3fffffffffffc - auVar138._8_8_ | uVar126 & auVar138._8_8_;
    secp256k1_gej_add_ge(local_7d8,local_7d8,(secp256k1_ge *)local_838);
    lVar128 = 0x1f;
    do {
      iVar129 = 4;
      do {
        secp256k1_gej_double(r_01,r_01);
        r_00 = local_7d8;
        iVar129 = iVar129 + -1;
      } while (iVar129 != 0);
      uVar127 = local_148[lVar128];
      uVar123 = ((int)uVar127 >> 0x1f) + uVar127 ^ (int)uVar127 >> 0x1f;
      local_828._8_8_ = local_6c8.x.n[3];
      local_828._0_8_ = local_6c8.x.n[2];
      local_838._8_8_ = local_6c8.x.n[1];
      local_838._0_8_ = local_6c8.x.n[0];
      auVar154._8_8_ = local_6c8.y.n[2];
      auVar154._0_8_ = local_6c8.y.n[1];
      auVar140._8_8_ = local_6c8.y.n[4];
      auVar140._0_8_ = local_6c8.y.n[3];
      lVar124 = 0;
      local_818 = local_6c8.x.n[4];
      uVar163 = local_6c8.y.n[0];
      do {
        bVar135 = (ulong)(uint)((int)uVar123 >> 1) * 0x58 + -0x58 == lVar124;
        uVar193 = (ulong)bVar135;
        uVar186 = (ulong)bVar135;
        uVar126 = -uVar186;
        uVar134 = -uVar193;
        uVar186 = uVar186 - 1;
        uVar193 = uVar193 - 1;
        auVar182._8_4_ = (undefined4)uVar193;
        auVar182._12_4_ = (undefined4)(uVar193 >> 0x20);
        auVar197._8_4_ = (int)uVar186;
        auVar197._0_8_ = uVar186;
        auVar197._12_4_ = (int)(uVar186 >> 0x20);
        uVar192 = (undefined4)(uVar126 >> 0x20);
        auVar93._8_4_ = (int)uVar126;
        auVar93._0_8_ = uVar126;
        auVar93._12_4_ = uVar192;
        local_838 = *(undefined1 (*) [16])(auStack_670 + lVar124) & auVar93 | local_838 & auVar197;
        auVar94._8_4_ = (int)uVar126;
        auVar94._0_8_ = uVar126;
        auVar94._12_4_ = uVar192;
        local_828 = *(undefined1 (*) [16])(auStack_660 + lVar124) & auVar94 | local_828 & auVar197;
        local_818 = *(ulong *)((long)auStack_650 + lVar124) & uVar126 | local_818 & uVar186;
        uVar163 = *(ulong *)((long)auStack_650 + lVar124 + 8) & uVar134 | uVar163 & uVar193;
        auVar182._0_8_ = uVar193;
        auVar190._8_4_ = (int)uVar134;
        auVar190._0_8_ = uVar134;
        auVar190._12_4_ = (int)(uVar134 >> 0x20);
        auVar154 = *(undefined1 (*) [16])(auStack_640 + lVar124) & auVar190 | auVar154 & auVar182;
        auVar140 = *(undefined1 (*) [16])(auStack_630 + lVar124) & auVar190 | auVar140 & auVar182;
        lVar124 = lVar124 + 0x58;
      } while (lVar124 != 0x268);
      local_7e8 = 0;
      local_7b8._0_4_ = ZEXT14(uVar127 != uVar123);
      uVar126 = (long)(int)local_7b8._0_4_ - 1;
      uVar134 = -(long)(int)local_7b8._0_4_;
      auVar161._8_4_ = auVar154._0_4_;
      auVar161._0_8_ = uVar163;
      auVar161._12_4_ = auVar154._4_4_;
      auVar167._0_8_ = 0x3ffffbfffff0bc - uVar163;
      auVar167._8_8_ = 0x3ffffffffffffc - auVar161._8_8_;
      auVar176._8_4_ = (int)uVar126;
      auVar176._0_8_ = uVar126;
      auVar176._12_4_ = (int)(uVar126 >> 0x20);
      auVar183._8_4_ = (int)uVar134;
      auVar183._0_8_ = uVar134;
      auVar183._12_4_ = (int)(uVar134 >> 0x20);
      auVar158 = auVar167 & auVar183 | auVar161 & auVar176;
      uStack_810 = auVar158._0_8_;
      uStack_808 = auVar158._8_8_;
      auVar155._0_8_ = auVar154._8_8_;
      auVar155._8_4_ = auVar140._0_4_;
      auVar155._12_4_ = auVar140._4_4_;
      auVar141._0_8_ = 0x3ffffffffffffc - auVar155._0_8_;
      auVar141._8_8_ = 0x3ffffffffffffc - auVar155._8_8_;
      auVar158 = auVar141 & auVar183 | auVar155 & auVar176;
      uStack_800 = auVar158._0_8_;
      uStack_7f8 = auVar158._8_8_;
      local_7f0 = uVar134 & 0x3fffffffffffc - auVar140._8_8_ | uVar126 & auVar140._8_8_;
      secp256k1_gej_add_ge(local_7d8,local_7d8,(secp256k1_ge *)local_838);
      uVar127 = local_b8[lVar128];
      uVar123 = ((int)uVar127 >> 0x1f) + uVar127 ^ (int)uVar127 >> 0x1f;
      local_828._8_8_ = local_408.x.n[3];
      local_828._0_8_ = local_408.x.n[2];
      local_838._8_8_ = local_408.x.n[1];
      local_838._0_8_ = local_408.x.n[0];
      auVar156._8_8_ = local_408.y.n[2];
      auVar156._0_8_ = local_408.y.n[1];
      auVar142._8_8_ = local_408.y.n[4];
      auVar142._0_8_ = local_408.y.n[3];
      lVar124 = 0;
      local_818 = local_408.x.n[4];
      uVar163 = local_408.y.n[0];
      do {
        bVar135 = (ulong)(uint)((int)uVar123 >> 1) * 0x58 + -0x58 == lVar124;
        uVar193 = (ulong)bVar135;
        uVar186 = (ulong)bVar135;
        uVar126 = -uVar186;
        uVar134 = -uVar193;
        uVar186 = uVar186 - 1;
        uVar193 = uVar193 - 1;
        auVar184._8_4_ = (undefined4)uVar193;
        auVar184._12_4_ = (undefined4)(uVar193 >> 0x20);
        auVar198._8_4_ = (int)uVar186;
        auVar198._0_8_ = uVar186;
        auVar198._12_4_ = (int)(uVar186 >> 0x20);
        uVar192 = (undefined4)(uVar126 >> 0x20);
        auVar95._8_4_ = (int)uVar126;
        auVar95._0_8_ = uVar126;
        auVar95._12_4_ = uVar192;
        local_838 = *(undefined1 (*) [16])(auStack_3b0 + lVar124) & auVar95 | local_838 & auVar198;
        auVar96._8_4_ = (int)uVar126;
        auVar96._0_8_ = uVar126;
        auVar96._12_4_ = uVar192;
        local_828 = *(undefined1 (*) [16])(auStack_3a0 + lVar124) & auVar96 | local_828 & auVar198;
        local_818 = *(ulong *)((long)auStack_390 + lVar124) & uVar126 | local_818 & uVar186;
        uVar163 = *(ulong *)((long)auStack_390 + lVar124 + 8) & uVar134 | uVar163 & uVar193;
        auVar184._0_8_ = uVar193;
        auVar191._8_4_ = (int)uVar134;
        auVar191._0_8_ = uVar134;
        auVar191._12_4_ = (int)(uVar134 >> 0x20);
        auVar156 = *(undefined1 (*) [16])(auStack_380 + lVar124) & auVar191 | auVar156 & auVar184;
        auVar142 = *(undefined1 (*) [16])(auStack_370 + lVar124) & auVar191 | auVar142 & auVar184;
        lVar124 = lVar124 + 0x58;
      } while (lVar124 != 0x268);
      local_7e8 = 0;
      local_7b8._0_4_ = ZEXT14(uVar127 != uVar123);
      uVar126 = (long)(int)local_7b8._0_4_ - 1;
      uVar134 = -(long)(int)local_7b8._0_4_;
      auVar162._8_4_ = auVar156._0_4_;
      auVar162._0_8_ = uVar163;
      auVar162._12_4_ = auVar156._4_4_;
      auVar168._0_8_ = 0x3ffffbfffff0bc - uVar163;
      auVar168._8_8_ = 0x3ffffffffffffc - auVar162._8_8_;
      auVar177._8_4_ = (int)uVar126;
      auVar177._0_8_ = uVar126;
      auVar177._12_4_ = (int)(uVar126 >> 0x20);
      auVar185._8_4_ = (int)uVar134;
      auVar185._0_8_ = uVar134;
      auVar185._12_4_ = (int)(uVar134 >> 0x20);
      auVar158 = auVar168 & auVar185 | auVar162 & auVar177;
      uStack_810 = auVar158._0_8_;
      uStack_808 = auVar158._8_8_;
      auVar157._0_8_ = auVar156._8_8_;
      auVar157._8_4_ = auVar142._0_4_;
      auVar157._12_4_ = auVar142._4_4_;
      auVar143._0_8_ = 0x3ffffffffffffc - auVar157._0_8_;
      auVar143._8_8_ = 0x3ffffffffffffc - auVar157._8_8_;
      auVar158 = auVar143 & auVar185 | auVar157 & auVar177;
      uStack_800 = auVar158._0_8_;
      uStack_7f8 = auVar158._8_8_;
      local_7f0 = uVar134 & 0x3fffffffffffc - auVar142._8_8_ | uVar126 & auVar142._8_8_;
      secp256k1_gej_add_ge(r_00,r_00,(secp256k1_ge *)local_838);
      bVar135 = lVar128 != 0;
      lVar128 = lVar128 + -1;
      r_01 = r_00;
    } while (bVar135);
    secp256k1_ge_neg((secp256k1_ge *)local_838,&local_6c8);
    secp256k1_gej_add_ge((secp256k1_gej *)local_7b8,r_00,(secp256k1_ge *)local_838);
    uVar126 = (long)(int)local_7e0 - 1;
    uVar134 = -(long)(int)local_7e0;
    auVar144._8_4_ = (int)uVar126;
    auVar144._0_8_ = uVar126;
    auVar144._12_4_ = (int)(uVar126 >> 0x20);
    auVar158 = *(undefined1 (*) [16])((r_00->x).n + 2);
    auVar169._8_4_ = (int)uVar134;
    auVar169._0_8_ = uVar134;
    auVar169._12_4_ = (int)(uVar134 >> 0x20);
    auVar119._4_4_ = local_7b8._4_4_;
    auVar119._0_4_ = local_7b8._0_4_;
    auVar119._8_8_ = local_7b8._8_8_;
    *(undefined1 (*) [16])(r_00->x).n =
         auVar119 & auVar169 | *(undefined1 (*) [16])(r_00->x).n & auVar144;
    *(undefined1 (*) [16])((r_00->x).n + 2) = auVar169 & local_7b8._16_16_ | auVar158 & auVar144;
    (r_00->x).n[4] = uVar134 & local_798 | uVar126 & (r_00->x).n[4];
    uVar126 = (long)(int)local_7e0 - 1;
    uVar134 = -(long)(int)local_7e0;
    auVar145._8_4_ = (int)uVar126;
    auVar145._0_8_ = uVar126;
    auVar145._12_4_ = (int)(uVar126 >> 0x20);
    auVar158 = *(undefined1 (*) [16])((r_00->y).n + 2);
    auVar178._8_4_ = (int)uVar134;
    auVar178._0_8_ = uVar134;
    auVar178._12_4_ = (int)(uVar134 >> 0x20);
    *(undefined1 (*) [16])(r_00->y).n =
         local_790 & auVar178 | *(undefined1 (*) [16])(r_00->y).n & auVar145;
    *(undefined1 (*) [16])((r_00->y).n + 2) = local_780 & auVar178 | auVar158 & auVar145;
    (r_00->y).n[4] = uVar134 & local_770 | uVar126 & (r_00->y).n[4];
    uVar126 = (long)(int)local_7e0 - 1;
    uVar134 = -(long)(int)local_7e0;
    auVar146._8_4_ = (int)uVar126;
    auVar146._0_8_ = uVar126;
    auVar146._12_4_ = (int)(uVar126 >> 0x20);
    auVar158 = *(undefined1 (*) [16])((r_00->z).n + 2);
    auVar170._8_4_ = (int)uVar134;
    auVar170._0_8_ = uVar134;
    auVar170._12_4_ = (int)(uVar134 >> 0x20);
    *(undefined1 (*) [16])(r_00->z).n =
         local_768 & auVar170 | *(undefined1 (*) [16])(r_00->z).n & auVar146;
    *(undefined1 (*) [16])((r_00->z).n + 2) = auVar170 & local_758 | auVar158 & auVar146;
    (r_00->z).n[4] = uVar134 & local_748 | uVar126 & (r_00->z).n[4];
    r_00->infinity = (local_740 ^ r_00->infinity) & local_7e0 ^ r_00->infinity;
    secp256k1_ge_neg((secp256k1_ge *)local_838,&local_408);
    secp256k1_gej_add_ge((secp256k1_gej *)local_7b8,r_00,(secp256k1_ge *)local_838);
    uVar126 = (long)(int)local_7dc - 1;
    uVar134 = -(long)(int)local_7dc;
    auVar147._8_4_ = (int)uVar126;
    auVar147._0_8_ = uVar126;
    auVar147._12_4_ = (int)(uVar126 >> 0x20);
    auVar158 = *(undefined1 (*) [16])((r_00->x).n + 2);
    auVar171._8_4_ = (int)uVar134;
    auVar171._0_8_ = uVar134;
    auVar171._12_4_ = (int)(uVar134 >> 0x20);
    auVar120._4_4_ = local_7b8._4_4_;
    auVar120._0_4_ = local_7b8._0_4_;
    auVar120._8_8_ = local_7b8._8_8_;
    *(undefined1 (*) [16])(r_00->x).n =
         auVar120 & auVar171 | *(undefined1 (*) [16])(r_00->x).n & auVar147;
    *(undefined1 (*) [16])((r_00->x).n + 2) = auVar171 & local_7b8._16_16_ | auVar158 & auVar147;
    (r_00->x).n[4] = uVar134 & local_798 | uVar126 & (r_00->x).n[4];
    uVar126 = (long)(int)local_7dc - 1;
    uVar134 = -(long)(int)local_7dc;
    auVar148._8_4_ = (int)uVar126;
    auVar148._0_8_ = uVar126;
    auVar148._12_4_ = (int)(uVar126 >> 0x20);
    auVar158 = *(undefined1 (*) [16])((r_00->y).n + 2);
    auVar179._8_4_ = (int)uVar134;
    auVar179._0_8_ = uVar134;
    auVar179._12_4_ = (int)(uVar134 >> 0x20);
    *(undefined1 (*) [16])(r_00->y).n =
         local_790 & auVar179 | *(undefined1 (*) [16])(r_00->y).n & auVar148;
    *(undefined1 (*) [16])((r_00->y).n + 2) = local_780 & auVar179 | auVar158 & auVar148;
    (r_00->y).n[4] = uVar134 & local_770 | uVar126 & (r_00->y).n[4];
    uVar126 = (long)(int)local_7dc - 1;
    uVar134 = -(long)(int)local_7dc;
    auVar149._8_4_ = (int)uVar126;
    auVar149._0_8_ = uVar126;
    auVar149._12_4_ = (int)(uVar126 >> 0x20);
    auVar158 = *(undefined1 (*) [16])((r_00->z).n + 2);
    auVar172._8_4_ = (int)uVar134;
    auVar172._0_8_ = uVar134;
    auVar172._12_4_ = (int)(uVar134 >> 0x20);
    *(undefined1 (*) [16])(r_00->z).n =
         local_768 & auVar172 | *(undefined1 (*) [16])(r_00->z).n & auVar149;
    *(undefined1 (*) [16])((r_00->z).n + 2) = auVar172 & local_758 | auVar158 & auVar149;
    (r_00->z).n[4] = uVar134 & local_748 | uVar126 & (r_00->z).n[4];
    r_00->infinity = (local_740 ^ r_00->infinity) & local_7dc ^ r_00->infinity;
    uVar126 = local_7c0->n[0];
    uVar134 = local_7c0->n[1];
    uVar186 = local_7c0->n[2];
    uVar193 = local_7c0->n[3];
    uVar1 = local_7c0->n[4];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_730.n[0];
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar193;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_730.n[1];
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar186;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_730.n[2];
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar134;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_730.n[3];
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar126;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_730.n[4];
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar1;
    uVar122 = SUB168(auVar11 * auVar67,0);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar122 & 0xfffffffffffff;
    auVar158 = auVar8 * auVar64 + auVar7 * auVar63 + auVar9 * auVar65 + auVar10 * auVar66 +
               auVar12 * ZEXT816(0x1000003d10);
    uVar125 = auVar158._0_8_;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar125 >> 0x34 | auVar158._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_730.n[0];
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar1;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_730.n[1];
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar193;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_730.n[2];
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar186;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_730.n[3];
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar134;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_730.n[4];
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar126;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar122 >> 0x34 | SUB168(auVar11 * auVar67,8) << 0xc;
    auVar158 = auVar13 * auVar68 + auVar109 + auVar14 * auVar69 + auVar15 * auVar70 +
               auVar16 * auVar71 + auVar17 * auVar72 + auVar18 * ZEXT816(0x1000003d10);
    uVar122 = auVar158._0_8_;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar122 >> 0x34 | auVar158._8_8_ << 0xc;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_730.n[0];
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar126;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_730.n[1];
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar1;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_730.n[2];
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar193;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_730.n[3];
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar186;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_730.n[4];
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar134;
    auVar158 = auVar20 * auVar74 + auVar110 + auVar21 * auVar75 + auVar22 * auVar76 +
               auVar23 * auVar77;
    uVar131 = auVar158._0_8_;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar131 >> 0x34 | auVar158._8_8_ << 0xc;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = (uVar131 & 0xfffffffffffff) << 4 | (uVar122 & 0xfffffffffffff) >> 0x30;
    auVar158 = auVar19 * auVar73 + ZEXT816(0x1000003d1) * auVar78;
    uVar131 = auVar158._0_8_;
    local_7c0->n[0] = uVar131 & 0xfffffffffffff;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar131 >> 0x34 | auVar158._8_8_ << 0xc;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_730.n[0];
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar134;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_730.n[1];
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar126;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_730.n[2];
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar1;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_730.n[3];
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar193;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_730.n[4];
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar186;
    auVar2 = auVar26 * auVar81 + auVar112 + auVar27 * auVar82 + auVar28 * auVar83;
    uVar131 = auVar2._0_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar131 & 0xfffffffffffff;
    auVar158 = auVar24 * auVar79 + auVar111 + auVar25 * auVar80 + auVar29 * ZEXT816(0x1000003d10);
    uVar133 = auVar158._0_8_;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar131 >> 0x34 | auVar2._8_8_ << 0xc;
    local_7c0->n[1] = uVar133 & 0xfffffffffffff;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar133 >> 0x34 | auVar158._8_8_ << 0xc;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_730.n[0];
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar186;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_730.n[1];
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar134;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_730.n[2];
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar126;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_730.n[3];
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar1;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_730.n[4];
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar193;
    auVar2 = auVar33 * auVar87 + auVar114 + auVar34 * auVar88;
    uVar126 = auVar2._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar126 & 0xfffffffffffff;
    auVar158 = auVar30 * auVar84 + auVar113 + auVar31 * auVar85 + auVar32 * auVar86 +
               auVar35 * ZEXT816(0x1000003d10);
    uVar134 = auVar158._0_8_;
    local_7c0->n[2] = uVar134 & 0xfffffffffffff;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = (uVar134 >> 0x34 | auVar158._8_8_ << 0xc) + (uVar125 & 0xfffffffffffff);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar126 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar115 = auVar36 * ZEXT816(0x1000003d10) + auVar115;
    uVar126 = auVar115._0_8_;
    local_7c0->n[3] = uVar126 & 0xfffffffffffff;
    local_7c0->n[4] = (uVar126 >> 0x34 | auVar115._8_8_ << 0xc) + (uVar122 & 0xffffffffffff);
  }
  else {
    r->infinity = 1;
    (r->x).n[0] = 0;
    (r->x).n[1] = 0;
    (r->x).n[2] = 0;
    (r->x).n[3] = 0;
    *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
    (r->y).n[1] = 0;
    (r->y).n[2] = 0;
    (r->y).n[3] = 0;
    (r->y).n[4] = 0;
    (r->z).n[0] = 0;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;

    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* build wnaf representation for q. */
    /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
    secp256k1_scalar_split_lambda(&q_1, &q_lam, scalar);
    skew_1   = secp256k1_wnaf_const(wnaf_1,   &q_1,   WINDOW_A - 1, 128);
    skew_lam = secp256k1_wnaf_const(wnaf_lam, &q_lam, WINDOW_A - 1, 128);

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    VERIFY_CHECK(!a->infinity);
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(128, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
    i = wnaf_lam[WNAF_SIZE_BITS(128, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
    secp256k1_gej_add_ge(r, r, &tmpa);
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(128, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double(r, r);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
        n = wnaf_lam[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }

    {
        /* Correct for wNAF skew */
        secp256k1_gej tmpj;

        secp256k1_ge_neg(&tmpa, &pre_a[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_1);

        secp256k1_ge_neg(&tmpa, &pre_a_lam[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_lam);
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);
}